

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryWriter::writeExports(WasmBinaryWriter *this)

{
  pointer puVar1;
  Export *pEVar2;
  int32_t start;
  U32LEB x;
  variant<wasm::Name,_wasm::HeapType> *pvVar3;
  pointer puVar4;
  BufferWithRandomAccess *this_00;
  
  if ((this->wasm->exports).
      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->wasm->exports).
      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    start = startSection<wasm::BinaryConsts::Section>(this,Export);
    BufferWithRandomAccess::operator<<
              (this->o,(U32LEB)(uint)((ulong)((long)(this->wasm->exports).
                                                                                                        
                                                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)(this->wasm->exports).
                                                                                                      
                                                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3));
    puVar1 = (this->wasm->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar4 = (this->wasm->exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1)
    {
      writeInlineString(this,(((puVar4->_M_t).
                               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                               .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->name).
                             super_IString.str);
      BufferWithRandomAccess::operator<<
                (this->o,(U32LEB)((puVar4->_M_t).
                                  super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                  .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->kind)
      ;
      pEVar2 = (puVar4->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      switch(pEVar2->kind) {
      case Function:
        if (*(__index_type *)
             ((long)&(pEVar2->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) == '\0'
           ) {
          pvVar3 = &pEVar2->value;
        }
        else {
          pvVar3 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
        }
        this_00 = this->o;
        x.value = getFunctionIndex(this,(IString)*(IString *)
                                                  &(pvVar3->
                                                  super__Variant_base<wasm::Name,_wasm::HeapType>).
                                                  super__Move_assign_alias<wasm::Name,_wasm::HeapType>
                                                  .
                                                  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>
                                  );
        break;
      case Table:
        if (*(__index_type *)
             ((long)&(pEVar2->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) == '\0'
           ) {
          pvVar3 = &pEVar2->value;
        }
        else {
          pvVar3 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
        }
        this_00 = this->o;
        x.value = getTableIndex(this,(IString)*(IString *)
                                               &(pvVar3->
                                                super__Variant_base<wasm::Name,_wasm::HeapType>).
                                                super__Move_assign_alias<wasm::Name,_wasm::HeapType>
                                                .
                                                super__Copy_assign_alias<wasm::Name,_wasm::HeapType>
                               );
        break;
      case Memory:
        if (*(__index_type *)
             ((long)&(pEVar2->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) == '\0'
           ) {
          pvVar3 = &pEVar2->value;
        }
        else {
          pvVar3 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
        }
        this_00 = this->o;
        x.value = getMemoryIndex(this,(IString)*(IString *)
                                                &(pvVar3->
                                                 super__Variant_base<wasm::Name,_wasm::HeapType>).
                                                 super__Move_assign_alias<wasm::Name,_wasm::HeapType>
                                                 .
                                                 super__Copy_assign_alias<wasm::Name,_wasm::HeapType>
                                );
        break;
      case Global:
        if (*(__index_type *)
             ((long)&(pEVar2->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) == '\0'
           ) {
          pvVar3 = &pEVar2->value;
        }
        else {
          pvVar3 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
        }
        this_00 = this->o;
        x.value = getGlobalIndex(this,(IString)*(IString *)
                                                &(pvVar3->
                                                 super__Variant_base<wasm::Name,_wasm::HeapType>).
                                                 super__Move_assign_alias<wasm::Name,_wasm::HeapType>
                                                 .
                                                 super__Copy_assign_alias<wasm::Name,_wasm::HeapType>
                                );
        break;
      case Tag:
        if (*(__index_type *)
             ((long)&(pEVar2->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) == '\0'
           ) {
          pvVar3 = &pEVar2->value;
        }
        else {
          pvVar3 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
        }
        this_00 = this->o;
        x.value = getTagIndex(this,(IString)*(IString *)
                                             &(pvVar3->
                                              super__Variant_base<wasm::Name,_wasm::HeapType>).
                                              super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                                              super__Copy_assign_alias<wasm::Name,_wasm::HeapType>);
        break;
      default:
        handle_unreachable("unexpected extern kind",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                           ,0x275);
      }
      BufferWithRandomAccess::operator<<(this_00,x);
    }
    finishSection(this,start);
    return;
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeExports() {
  if (wasm->exports.size() == 0) {
    return;
  }
  auto start = startSection(BinaryConsts::Section::Export);
  o << U32LEB(wasm->exports.size());
  for (auto& curr : wasm->exports) {
    writeInlineString(curr->name.str);
    o << U32LEB(int32_t(curr->kind));
    switch (curr->kind) {
      case ExternalKind::Function:
        o << U32LEB(getFunctionIndex(*curr->getInternalName()));
        break;
      case ExternalKind::Table:
        o << U32LEB(getTableIndex(*curr->getInternalName()));
        break;
      case ExternalKind::Memory:
        o << U32LEB(getMemoryIndex(*curr->getInternalName()));
        break;
      case ExternalKind::Global:
        o << U32LEB(getGlobalIndex(*curr->getInternalName()));
        break;
      case ExternalKind::Tag:
        o << U32LEB(getTagIndex(*curr->getInternalName()));
        break;
      default:
        WASM_UNREACHABLE("unexpected extern kind");
    }
  }
  finishSection(start);
}